

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

int __thiscall
gl4cts::UncommittedRegionsAccessTestCase::init
          (UncommittedRegionsAccessTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int local_18 [2];
  
  iVar2 = SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets;
  local_18[1] = 0x9100;
  iVar1._M_current =
       (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
       mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
      mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,local_18 + 1);
    iVar2 = extraout_EAX;
  }
  else {
    *iVar1._M_current = 0x9100;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_18[0] = 0x9102;
  iVar1._M_current =
       (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
       mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
      mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,local_18);
    iVar2 = extraout_EAX_00;
  }
  else {
    *iVar1._M_current = 0x9102;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return iVar2;
}

Assistant:

void UncommittedRegionsAccessTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}